

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

bool __thiscall crnlib::qdxt1::update_progress(qdxt1 *this,uint value,uint max_value)

{
  progress_callback_func p_Var1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  p_Var1 = (this->m_params).m_pProgress_func;
  bVar4 = true;
  if (p_Var1 != (progress_callback_func)0x0) {
    if (max_value == 0) {
      iVar3 = 100;
    }
    else {
      iVar3 = ((max_value >> 1) + value * this->m_progress_range) / max_value +
              this->m_progress_start;
    }
    if (iVar3 != this->m_prev_percentage_complete) {
      this->m_prev_percentage_complete = iVar3;
      bVar2 = (*p_Var1)((iVar3 * (this->m_params).m_progress_range) / 100 +
                        (this->m_params).m_progress_start,(this->m_params).m_pProgress_data);
      if (!bVar2) {
        this->m_canceled = true;
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool qdxt1::update_progress(uint value, uint max_value) {
  if (!m_params.m_pProgress_func)
    return true;

  uint percentage = max_value ? (m_progress_start + (value * m_progress_range + (max_value / 2)) / max_value) : 100;
  if ((int)percentage == m_prev_percentage_complete)
    return true;
  m_prev_percentage_complete = percentage;

  if (!m_params.m_pProgress_func(m_params.m_progress_start + (percentage * m_params.m_progress_range) / 100U, m_params.m_pProgress_data)) {
    m_canceled = true;
    return false;
  }

  return true;
}